

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthUdpPort.cpp
# Opt level: O1

uint __thiscall EthUdpPort::GetPrefixOffset(EthUdpPort *this,MsgType msg)

{
  ostream *this_00;
  uint uVar1;
  long *plVar2;
  
  if (msg < (RD_FW_BDATA|WR_FW_HEADER)) {
    uVar1 = *(uint *)(&DAT_0011ffac + (ulong)msg * 4);
  }
  else {
    this_00 = (this->super_EthBasePort).super_BasePort.outStr;
    std::__ostream_insert<char,std::char_traits<char>>
              (this_00,"EthUdpPort::GetPrefixOffset: Invalid type: ",0x2b);
    plVar2 = (long *)std::ostream::operator<<((ostream *)this_00,msg);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

unsigned int EthUdpPort::GetPrefixOffset(MsgType msg) const
{
    switch (msg) {
        case WR_CTRL:      return 0;
        case WR_FW_HEADER: return FW_CTRL_SIZE;
        case WR_FW_BDATA:  return FW_CTRL_SIZE+FW_BWRITE_HEADER_SIZE;
        case RD_FW_HEADER: return 0;
        case RD_FW_BDATA:  return FW_BRESPONSE_HEADER_SIZE;
    }
    outStr << "EthUdpPort::GetPrefixOffset: Invalid type: " << msg << std::endl;
    return 0;
}